

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::
DecodeAttributeConnectivitiesOnFaceLegacy
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder> *this,
          CornerIndex corner)

{
  uint uVar1;
  pointer pAVar2;
  bool bVar3;
  uint uVar4;
  uint local_48;
  uint local_44 [3];
  long local_38;
  
  local_44[0] = corner.value_;
  if (corner.value_ == 0xffffffff) {
    local_44[1] = 0xffffffff;
    local_44[2] = -1;
  }
  else {
    local_44[1] = corner.value_ - 2;
    if ((corner.value_ + 1) % 3 != 0) {
      local_44[1] = corner.value_ + 1;
    }
    if (corner.value_ % 3 == 0) {
      local_44[2] = corner.value_ + 2;
    }
    else {
      local_44[2] = corner.value_ - 1;
    }
  }
  for (local_38 = 0; local_38 != 3; local_38 = local_38 + 1) {
    uVar1 = local_44[local_38];
    if (((ulong)uVar1 == 0xffffffff) ||
       (*(int *)(*(long *)&(((this->corner_table_)._M_t.
                             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                             .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl)->
                           opposite_corners_).vector_.
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                + (ulong)uVar1 * 4) == -1)) {
      uVar4 = 0;
      while( true ) {
        pAVar2 = (this->attribute_data_).
                 super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(this->attribute_data_).
                           super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) / 0x140) <=
            (ulong)uVar4) break;
        local_48 = uVar1;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&pAVar2[uVar4].attribute_seam_corners,(int *)&local_48);
        uVar4 = uVar4 + 1;
      }
    }
    else {
      for (uVar4 = 0;
          (ulong)uVar4 <
          (ulong)(((long)(this->attribute_data_).
                         super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->attribute_data_).
                        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x140); uVar4 = uVar4 + 1) {
        bVar3 = MeshEdgebreakerTraversalDecoder::DecodeAttributeSeam
                          (&(this->traversal_decoder_).super_MeshEdgebreakerTraversalDecoder,uVar4);
        if (bVar3) {
          local_48 = uVar1;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (&(this->attribute_data_).
                      super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar4].attribute_seam_corners,
                     (int *)&local_48);
        }
      }
    }
  }
  return true;
}

Assistant:

bool MeshEdgebreakerDecoderImpl<TraversalDecoder>::
    DecodeAttributeConnectivitiesOnFaceLegacy(CornerIndex corner) {
  // Three corners of the face.
  const CornerIndex corners[3] = {corner, corner_table_->Next(corner),
                                  corner_table_->Previous(corner)};

  for (int c = 0; c < 3; ++c) {
    const CornerIndex opp_corner = corner_table_->Opposite(corners[c]);
    if (opp_corner == kInvalidCornerIndex) {
      // Don't decode attribute seams on boundary edges (every boundary edge
      // is automatically an attribute seam).
      for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
        attribute_data_[i].attribute_seam_corners.push_back(corners[c].value());
      }
      continue;
    }

    for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
      const bool is_seam = traversal_decoder_.DecodeAttributeSeam(i);
      if (is_seam) {
        attribute_data_[i].attribute_seam_corners.push_back(corners[c].value());
      }
    }
  }
  return true;
}